

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dml.cpp
# Opt level: O0

void __thiscall dml::listRecords(dml *this,string *typeName,ostream *stream)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  pointer ptVar3;
  int *piVar4;
  iterator iVar5;
  iterator iVar6;
  reference prVar7;
  ostream *poVar8;
  size_t __nbytes;
  void *__buf;
  int local_42c;
  int i_1;
  record *record;
  iterator __end1;
  iterator __begin1;
  vector<record,_std::allocator<record>_> *__range1;
  __normal_iterator<record_*,_std::vector<record,_std::allocator<record>_>_> local_3e0;
  const_iterator local_3d8;
  undefined1 local_3d0 [8];
  vector<record,_std::allocator<record>_> pageRecords;
  page page;
  int i;
  int offset;
  file file;
  string local_348 [32];
  string local_328 [39];
  allocator local_301;
  string local_300 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0 [32];
  fstream local_280 [8];
  fstream currFile;
  int local_6c;
  int local_68;
  byte local_62;
  byte local_61;
  int local_60;
  uint8_t slotSize;
  uint8_t recordSize;
  int currFileLink;
  allocator<record> local_49;
  undefined1 local_48 [8];
  vector<record,_std::allocator<record>_> records;
  _Self local_28;
  iterator type;
  ostream *stream_local;
  string *typeName_local;
  dml *this_local;
  
  type._M_node = (_Base_ptr)stream;
  local_28._M_node = (_Base_ptr)SystemCatalog::getType(this->systemCatalog,typeName);
  records.super__Vector_base<record,_std::allocator<record>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::set<type,_std::less<type>,_std::allocator<type>_>::end
                          (&this->systemCatalog->types);
  bVar1 = std::operator==(&local_28,
                          (_Self *)&records.super__Vector_base<record,_std::allocator<record>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar1) {
    std::allocator<record>::allocator(&local_49);
    std::vector<record,_std::allocator<record>_>::vector
              ((vector<record,_std::allocator<record>_> *)local_48,0,&local_49);
    std::allocator<record>::~allocator(&local_49);
    local_60 = 1;
    ptVar3 = std::_Rb_tree_const_iterator<type>::operator->(&local_28);
    local_61 = ptVar3->numFields * '\x04' + 1;
    iVar6._M_current = (record *)(ulong)(local_61 + 1);
    local_68 = (int)(0x7fb / (ulong)iVar6._M_current);
    local_6c = 0xff;
    piVar4 = std::min<int>(&local_68,&local_6c);
    local_62 = (byte)*piVar4;
    do {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_300,"data/",&local_301);
      std::__cxx11::string::string(local_348,(string *)typeName);
      truncateName(local_328);
      std::operator+(local_2e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300)
      ;
      std::operator+(local_2c0,(char *)local_2e0);
      std::__cxx11::to_string((__cxx11 *)&file.nextFile,local_60);
      std::operator+(local_2a0,local_2c0);
      _Var2 = std::operator|(_S_in,_S_bin);
      std::fstream::fstream(local_280,(string *)local_2a0,_Var2);
      std::__cxx11::string::~string((string *)local_2a0);
      std::__cxx11::string::~string((string *)&file.nextFile);
      std::__cxx11::string::~string((string *)local_2c0);
      std::__cxx11::string::~string((string *)local_2e0);
      std::__cxx11::string::~string((string *)local_328);
      std::__cxx11::string::~string(local_348);
      std::__cxx11::string::~string(local_300);
      std::allocator<char>::~allocator((allocator<char> *)&local_301);
      ::file::file((file *)&i);
      ::file::read((file *)&i,(int)local_280,__buf,(size_t)iVar6._M_current);
      page.slots._4_4_ = 0x16;
      for (page.slots._0_4_ = file._36_4_; 0 < (int)page.slots;
          page.slots._0_4_ = (int)page.slots + -1) {
        __nbytes = (size_t)local_62;
        ::page::page((page *)&pageRecords.super__Vector_base<record,_std::allocator<record>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,'\0',(uint)local_61,
                     local_62);
        ::page::read((page *)&pageRecords.super__Vector_base<record,_std::allocator<record>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,(int)local_280,
                     (void *)(ulong)page.slots._4_4_,__nbytes);
        ptVar3 = std::_Rb_tree_const_iterator<type>::operator->(&local_28);
        ::page::getRecords((vector<record,_std::allocator<record>_> *)local_3d0,
                           (page *)&pageRecords.super__Vector_base<record,_std::allocator<record>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,local_280,
                           page.slots._4_4_,ptVar3->numFields);
        local_3e0._M_current =
             (record *)
             std::vector<record,_std::allocator<record>_>::end
                       ((vector<record,_std::allocator<record>_> *)local_48);
        __gnu_cxx::__normal_iterator<record_const*,std::vector<record,std::allocator<record>>>::
        __normal_iterator<record*>
                  ((__normal_iterator<record_const*,std::vector<record,std::allocator<record>>> *)
                   &local_3d8,&local_3e0);
        iVar5 = std::vector<record,_std::allocator<record>_>::begin
                          ((vector<record,_std::allocator<record>_> *)local_3d0);
        iVar6 = std::vector<record,_std::allocator<record>_>::end
                          ((vector<record,_std::allocator<record>_> *)local_3d0);
        std::vector<record,std::allocator<record>>::
        insert<__gnu_cxx::__normal_iterator<record*,std::vector<record,std::allocator<record>>>,void>
                  ((vector<record,std::allocator<record>> *)local_48,local_3d8,
                   (__normal_iterator<record_*,_std::vector<record,_std::allocator<record>_>_>)
                   iVar5._M_current,
                   (__normal_iterator<record_*,_std::vector<record,_std::allocator<record>_>_>)
                   iVar6._M_current);
        page.slots._4_4_ = page.slots._4_4_ + 0x800;
        std::vector<record,_std::allocator<record>_>::~vector
                  ((vector<record,_std::allocator<record>_> *)local_3d0);
        ::page::~page((page *)&pageRecords.super__Vector_base<record,_std::allocator<record>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      local_60 = file._40_4_;
      ::file::~file((file *)&i);
      std::fstream::~fstream(local_280);
    } while (local_60 != 0);
    iVar6 = std::vector<record,_std::allocator<record>_>::begin
                      ((vector<record,_std::allocator<record>_> *)local_48);
    iVar5 = std::vector<record,_std::allocator<record>_>::end
                      ((vector<record,_std::allocator<record>_> *)local_48);
    std::sort<__gnu_cxx::__normal_iterator<record*,std::vector<record,std::allocator<record>>>>
              ((__normal_iterator<record_*,_std::vector<record,_std::allocator<record>_>_>)
               iVar6._M_current,
               (__normal_iterator<record_*,_std::vector<record,_std::allocator<record>_>_>)
               iVar5._M_current);
    __end1 = std::vector<record,_std::allocator<record>_>::begin
                       ((vector<record,_std::allocator<record>_> *)local_48);
    record = (record *)
             std::vector<record,_std::allocator<record>_>::end
                       ((vector<record,_std::allocator<record>_> *)local_48);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<record_*,_std::vector<record,_std::allocator<record>_>_>
                                       *)&record), bVar1) {
      prVar7 = __gnu_cxx::__normal_iterator<record_*,_std::vector<record,_std::allocator<record>_>_>
               ::operator*(&__end1);
      for (local_42c = 0; local_42c < (int)(uint)prVar7->numFields; local_42c = local_42c + 1) {
        poVar8 = (ostream *)std::ostream::operator<<(type._M_node,prVar7->fields[local_42c]);
        std::operator<<(poVar8," ");
      }
      std::ostream::operator<<(type._M_node,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::__normal_iterator<record_*,_std::vector<record,_std::allocator<record>_>_>::
      operator++(&__end1);
    }
    std::vector<record,_std::allocator<record>_>::~vector
              ((vector<record,_std::allocator<record>_> *)local_48);
  }
  return;
}

Assistant:

void dml::listRecords(string typeName, ostream &stream) {
    auto type = systemCatalog->getType(typeName);

    if(type == systemCatalog->types.end()) { return; }

    auto records = vector<record>(0);

    int currFileLink = 1;

    auto recordSize = (uint8_t) (RECORD_ID + type->numFields * FIELD);

    auto slotSize = (uint8_t) min((PAGE - PAGE_ID - NUM_RECORDS) / (recordSize+ 1), 255);

    do {
        fstream currFile(ROOT + truncateName(typeName) + INFIX + to_string(currFileLink), INBIN);

        file file;
        file.read(currFile);

        int offset = IS_FULL + TYPE_NAME + NUM_PAGES + NUM_RECORDS + LINK_TO_FILE + LINK_TO_FILE;

        for (int i = file.numRecords; i > 0; --i) {
            page page(0, recordSize, slotSize);

            page.read(currFile, offset);

            vector<record> pageRecords = page.getRecords(currFile, offset, type->numFields);

            records.insert(records.end(), pageRecords.begin(), pageRecords.end());

            offset += PAGE;
        }

        currFileLink = file.nextFile;
    } while(currFileLink != 0);

    sort(records.begin(), records.end());

    for (const auto &record: records) {

        for (int i = 0; i < record.numFields; ++i) {
            stream << record.fields[i] << " ";
        }

        stream << endl;
    }
}